

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O2

void run_dataset<mnist>(size_t tree_max_leaf_size,size_t forest_size,size_t forest_max_leaf_size,
                       size_t forest_max_leaves_visited)

{
  size_t sVar1;
  ostream *poVar2;
  vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_> nns;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> test;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> train;
  string fn_nns_gt;
  _Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
  local_88;
  _Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> local_70;
  _Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  mnist::read_train();
  mnist::read_test();
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_40,&mnist::dataset_name_abi_cxx11_,"_nns_gt.bin");
  run_kd_tree<std::array<float,784ul>,float>
            ((vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *)
             &local_58,
             (vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *)
             &local_70,&local_40,(max_leaf_size_t)tree_max_leaf_size,
             (vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
              *)&local_88);
  sVar1 = run_kd_forest<std::array<float,784ul>,float>
                    ((vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
                     )&local_58,
                     (vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
                     )&local_70,
                     (vector<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>
                      *)&local_88,forest_size,forest_max_leaf_size,forest_max_leaves_visited);
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 10;
  poVar2 = std::operator<<((ostream *)&std::cout,"Precision: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(float)sVar1 /
                             (float)(ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish
                                            - (long)local_88._M_impl.super__Vector_impl_data.
                                                    _M_start >> 3));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  pico_tree::std::
  _Vector_base<pico_tree::neighbor<int,_float>,_std::allocator<pico_tree::neighbor<int,_float>_>_>::
  ~_Vector_base(&local_88);
  pico_tree::std::_Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
  ::~_Vector_base(&local_70);
  pico_tree::std::_Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void run_dataset(
    std::size_t tree_max_leaf_size,
    std::size_t forest_size,
    std::size_t forest_max_leaf_size,
    std::size_t forest_max_leaves_visited) {
  using Point = typename Dataset_::point_type;
  using scalar_type = typename Point::value_type;

  auto train = Dataset_::read_train();
  auto test = Dataset_::read_test();
  std::vector<pico_tree::neighbor<int, scalar_type>> nns;
  std::string fn_nns_gt = Dataset_::dataset_name + "_nns_gt.bin";

  run_kd_tree(train, test, fn_nns_gt, tree_max_leaf_size, nns);

  std::size_t equal = run_kd_forest(
      train,
      test,
      nns,
      forest_size,
      forest_max_leaf_size,
      forest_max_leaves_visited);

  std::cout << std::setprecision(10);
  std::cout << "Precision: "
            << (static_cast<float>(equal) / static_cast<float>(nns.size()))
            << std::endl;
}